

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O0

uint32_t * pack17_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  uint32_t base_local;
  
  *out = *in - base;
  *out = (in[1] - base) * 0x20000 | *out;
  puVar1 = out + 1;
  *puVar1 = in[1] - base >> 0xf;
  *puVar1 = (in[2] - base) * 4 | *puVar1;
  *puVar1 = (in[3] - base) * 0x80000 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[3] - base >> 0xd;
  *puVar1 = (in[4] - base) * 0x10 | *puVar1;
  *puVar1 = (in[5] - base) * 0x200000 | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[5] - base >> 0xb;
  *puVar1 = (in[6] - base) * 0x40 | *puVar1;
  *puVar1 = (in[7] - base) * 0x800000 | *puVar1;
  out[4] = in[7] - base >> 9;
  return out + 5;
}

Assistant:

uint32_t * pack17_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  17 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 17  -  2 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  2 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  19 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 17  -  4 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  4 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  21 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 17  -  6 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  6 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  23 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 17  -  8 );
    ++in;

    return out + 1;
}